

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

QString * QtMWidgets::accomodateString
                    (QString *__return_storage_ptr__,QString *text,QRect *r,int flags,
                    QStyleOption *opt)

{
  uint uVar1;
  QRect *pQVar2;
  int iVar3;
  int iVar4;
  qsizetype qVar5;
  QRect *pQVar6;
  QRect QVar7;
  QString local_128;
  char16_t local_10a;
  QString local_108;
  QRect local_ec;
  char16_t local_da;
  undefined1 local_d8 [8];
  QString tmp;
  QString local_a8;
  QRect local_90;
  char16_t local_7e;
  int local_6c;
  int local_68;
  int x;
  int w;
  undefined8 local_58;
  QRect *local_50;
  QRect *b;
  QStyleOption *opt_local;
  QRect *pQStack_38;
  int flags_local;
  QRect *r_local;
  QString *text_local;
  QString *res;
  char16_t *str;
  qsizetype *local_10;
  
  b = (QRect *)opt;
  opt_local._4_4_ = flags;
  pQStack_38 = r;
  r_local = (QRect *)text;
  text_local = __return_storage_ptr__;
  _w = (QRect)QFontMetrics::boundingRect
                        ((QRect *)(opt + 0x20),(int)r,(QString *)(ulong)(uint)flags,(int)text,
                         (int *)0x0);
  local_50 = (QRect *)&w;
  x._3_1_ = 0;
  QString::QString(__return_storage_ptr__,(QString *)r_local);
  iVar3 = QRect::width(local_50);
  iVar4 = QRect::width(pQStack_38);
  if (iVar4 < iVar3) {
    local_68 = 0;
    local_6c = 0;
    QString::clear(__return_storage_ptr__);
    while (iVar3 = local_68, iVar4 = QRect::width(pQStack_38), iVar3 <= iVar4 / 2) {
      local_7e = (char16_t)QString::at((QString *)r_local,(long)local_6c);
      QString::append((QChar *)__return_storage_ptr__);
      local_6c = local_6c + 1;
      QVar7 = (QRect)QFontMetrics::boundingRect
                               (b + 2,(int)pQStack_38,(QString *)(ulong)opt_local._4_4_,
                                (int)__return_storage_ptr__,(int *)0x0);
      local_90 = QVar7;
      local_68 = QRect::width(&local_90);
    }
    local_10 = &tmp.d.size;
    str = L"...";
    res = (QString *)anon_var_dwarf_29f598;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&tmp.d.size,(Data *)0x0,L"...",3);
    QString::QString(&local_a8,(DataPointer *)&tmp.d.size);
    QString::append((QString *)__return_storage_ptr__);
    QString::~QString(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tmp.d.size);
    qVar5 = QString::length((QString *)r_local);
    local_6c = (int)qVar5 + -1;
    local_da = (char16_t)QString::at((QString *)r_local,(long)local_6c);
    QString::QString((QString *)local_d8,(QChar *)(ulong)(ushort)local_da);
    while( true ) {
      pQVar2 = pQStack_38;
      uVar1 = opt_local._4_4_;
      pQVar6 = b + 2;
      operator+(&local_108,__return_storage_ptr__,(QString *)local_d8);
      QVar7 = (QRect)QFontMetrics::boundingRect
                               (pQVar6,(int)pQVar2,(QString *)(ulong)uVar1,(int)&local_108,
                                (int *)0x0);
      local_ec = QVar7;
      iVar3 = QRect::width(&local_ec);
      iVar4 = QRect::width(pQStack_38);
      QString::~QString(&local_108);
      if (iVar4 < iVar3) break;
      local_6c = local_6c + -1;
      local_10a = (char16_t)QString::at((QString *)r_local,(long)local_6c);
      QString::prepend((QString *)local_d8,(QChar)local_10a);
    }
    QString::length((QString *)r_local);
    QString::right((longlong)&local_128);
    QString::append((QString *)__return_storage_ptr__);
    QString::~QString(&local_128);
    QString::~QString((QString *)local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

QString
accomodateString( const QString & text, const QRect & r,
	int flags, const QStyleOption & opt )
{
	const QRect & b = opt.fontMetrics.boundingRect( r, flags, text );

	QString res = text;

	if( b.width() > r.width() )
	{
		int w = 0;
		int x = 0;

		res.clear();

		while( w <= ( r.width() ) / 2 )
		{
			res.append( text.at( x ) );
			++x;
			w = opt.fontMetrics.boundingRect( r, flags, res ).width();
		}

		res.append( QStringLiteral( "..." ) );

		x = text.length() - 1;

		QString tmp = text.at( x );

		while( opt.fontMetrics.boundingRect( r, flags, res + tmp ).width() <= r.width() )
		{
			--x;
			tmp.prepend( text.at( x ) );
		}

		res.append( text.right( text.length() - x - 1 ) );
	}

	return res;
}